

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O3

void __thiscall irr::gui::IGUIElement::move(IGUIElement *this,vector2d<int> absoluteMovement)

{
  undefined1 auVar1 [12];
  vector2d<int> vVar2;
  vector2d<int> vVar3;
  uint uVar4;
  rect<int> local_18;
  
  vVar2 = (this->DesiredRect).UpperLeftCorner;
  vVar3 = (this->DesiredRect).LowerRightCorner;
  uVar4 = (uint)(((ulong)absoluteMovement & 0xffffffff00000000) >> 0x20);
  auVar1._4_4_ = absoluteMovement.X;
  auVar1._0_4_ = uVar4;
  auVar1._8_4_ = absoluteMovement.Y;
  local_18.UpperLeftCorner.Y = (int)(((ulong)uVar4 << 0x20) + (long)vVar2 >> 0x20);
  local_18.LowerRightCorner.X = (int)(auVar1._4_8_ + (long)vVar3);
  local_18.UpperLeftCorner.X = (int)((long)vVar2 + (long)absoluteMovement);
  local_18.LowerRightCorner.Y =
       (int)((long)vVar3 + ((ulong)absoluteMovement & 0xffffffff00000000) >> 0x20);
  setRelativePosition(this,&local_18);
  return;
}

Assistant:

virtual void move(core::position2d<s32> absoluteMovement)
	{
		setRelativePosition(DesiredRect + absoluteMovement);
	}